

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affine.c
# Opt level: O3

void glmc_rotated_at(vec4 *m,float *pivot,float angle,float *axis)

{
  float fVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float local_90;
  float fStack_24;
  
  fVar7 = m[3][1];
  fVar6 = m[3][2];
  uVar2 = *(undefined8 *)pivot;
  fVar14 = (float)uVar2;
  fVar1 = pivot[2];
  local_90 = 0.0;
  m[3][0] = m[3][0] + fVar14;
  m[3][1] = fVar7 + pivot[1];
  m[3][2] = fVar6 + pivot[2];
  fVar6 = cosf(angle);
  fVar7 = axis[2];
  fVar18 = 1.0 - fVar6;
  fVar10 = (float)*(undefined8 *)axis;
  fVar12 = (float)((ulong)*(undefined8 *)axis >> 0x20);
  fVar15 = SQRT(fVar7 * fVar7 + fVar10 * fVar10 + fVar12 * fVar12);
  fVar8 = 1.0 / fVar15;
  fVar10 = (float)(~((int)((uint)(fVar15 < 1.1920929e-07) << 0x1f) >> 0x1f) & (uint)(fVar8 * fVar10)
                  );
  fVar12 = (float)(~((int)((uint)(fVar15 < 1.1920929e-07) << 0x1f) >> 0x1f) & (uint)(fVar8 * fVar12)
                  );
  if (1.1920929e-07 <= fVar15) {
    local_90 = fVar8 * fVar7;
  }
  fVar8 = fVar18 * fVar12;
  fVar15 = fVar18 * local_90;
  fVar7 = sinf(angle);
  fVar18 = fVar18 * fVar10;
  fVar16 = fVar10 * fVar8 - local_90 * fVar7;
  fVar11 = fVar6 + fVar18 * fVar10;
  fVar13 = local_90 * fVar7 + fVar18 * fVar12;
  fVar9 = fVar10 * fVar15 + fVar7 * fVar12;
  fVar17 = fVar18 * local_90 - fVar7 * fVar12;
  fVar21 = fVar12 * fVar15 - fVar7 * fVar10;
  fVar19 = local_90 * fVar8 + fVar7 * fVar10;
  fVar20 = fVar6 + fVar8 * fVar12;
  fVar6 = fVar15 * local_90 + fVar6;
  fVar7 = (*m)[0];
  fVar10 = (*m)[1];
  fVar12 = (*m)[2];
  fVar8 = m[1][0];
  fVar18 = m[1][1];
  fVar15 = m[1][2];
  fVar3 = m[2][0];
  fVar4 = m[2][1];
  fVar5 = m[2][2];
  (*m)[0] = fVar12 * fVar9 + fVar10 * fVar16 + fVar7 * fVar11;
  (*m)[1] = fVar12 * fVar21 + fVar10 * fVar20 + fVar7 * fVar13;
  (*m)[2] = fVar12 * fVar6 + fVar10 * fVar19 + fVar7 * fVar17;
  (*m)[3] = fVar12 * 0.0 + fVar10 * 0.0 + fVar7 * 0.0;
  m[1][0] = fVar15 * fVar9 + fVar18 * fVar16 + fVar8 * fVar11;
  m[1][1] = fVar15 * fVar21 + fVar18 * fVar20 + fVar8 * fVar13;
  m[1][2] = fVar15 * fVar6 + fVar18 * fVar19 + fVar8 * fVar17;
  m[1][3] = fVar15 * 0.0 + fVar18 * 0.0 + fVar8 * 0.0;
  m[2][0] = fVar5 * fVar9 + fVar4 * fVar16 + fVar3 * fVar11;
  m[2][1] = fVar5 * fVar21 + fVar4 * fVar20 + fVar3 * fVar13;
  m[2][2] = fVar5 * fVar6 + fVar4 * fVar19 + fVar3 * fVar17;
  m[2][3] = fVar5 * 0.0 + fVar4 * 0.0 + fVar3 * 0.0;
  *(float *)((long)(m + 3) + 0) = 0.0;
  *(float *)((long)(m + 3) + 4) = 0.0;
  *(float *)((long)(m + 3) + 8) = 0.0;
  *(float *)((long)(m + 3) + 0xc) = 1.0;
  fStack_24 = (float)((ulong)uVar2 >> 0x20);
  *(ulong *)m[3] = CONCAT44(0.0 - fStack_24,0.0 - fVar14);
  m[3][2] = 0.0 - fVar1;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_rotated_at(mat4 m, vec3 pivot, float angle, vec3 axis) {
  glm_rotated_at(m, pivot, angle, axis);
}